

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BufferLimitedLabelCase::iterate
          (BufferLimitedLabelCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  deBool dVar6;
  undefined4 extraout_var;
  undefined8 uVar8;
  size_t sVar9;
  NotSupportedError *this_00;
  MessageBuilder *pMVar10;
  allocator<char> local_2dd;
  int outlen;
  undefined1 local_2d8 [32];
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  ScopedLogSection superSection;
  char buffer [64];
  code *local_208;
  int local_200;
  MessageBuilder local_1f8;
  ResultCollector result;
  long lVar7;
  
  bVar3 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (!bVar3) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
               ,0x874);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8," // ERROR: ",(allocator<char> *)buffer);
  tcu::ResultCollector::ResultCollector(&result,pTVar2,(string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  outlen = -1;
  uVar8 = (**(code **)(lVar7 + 0x640))(0x9117,0);
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"Got Error ",(allocator<char> *)&superSection);
    local_208 = glu::getErrorName;
    local_200 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_208);
    std::operator+(&local_290,&local_2b0,&local_270);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   &local_290,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   "fenceSync");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  uVar5 = (**(code **)(lVar7 + 0x3f0))(0x8b30);
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"Got Error ",(allocator<char> *)&superSection);
    local_208 = glu::getErrorName;
    local_200 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_208);
    std::operator+(&local_290,&local_2b0,&local_270);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   &local_290,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   "createShader");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"Shader",(allocator<char> *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"Shader object",(allocator<char> *)&local_2b0);
  tcu::ScopedLogSection::ScopedLogSection
            (&superSection,pTVar2,(string *)&local_1f8,(string *)local_2d8);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Setting label to string: \"");
  std::operator<<((ostream *)poVar1,"This is a debug label");
  std::operator<<((ostream *)poVar1,"\"");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  (**(code **)(lVar7 + 0xfc0))(0x82e1,uVar5,0xffffffffffffffff,"This is a debug label");
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"Got Error ",(allocator<char> *)&section);
    local_208 = glu::getErrorName;
    local_200 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_208);
    std::operator+(&local_290,&local_2b0,&local_270);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   &local_290,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   "objectLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"QueryAll",(allocator<char> *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"Query All",(allocator<char> *)&local_2b0);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&local_1f8,(string *)local_2d8);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Querying whole label, buffer size = 22");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  builtin_strncpy(buffer,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x40);
  (**(code **)(lVar7 + 0x958))(0x82e1,uVar5,0x16,&outlen);
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Got Error ",&local_2dd)
    ;
    local_208 = glu::getErrorName;
    local_200 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_208);
    std::operator+(&local_290,&local_2b0,&local_270);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   &local_290,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   "getObjectLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  if (outlen == 0x15) {
    if (buffer[0x15] != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Buffer was not null-terminated",(allocator<char> *)local_2d8)
      ;
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
LAB_003d4e4c:
      pMVar10 = &local_1f8;
      goto LAB_003d4e54;
    }
    if (buffer[0x16] != 'X') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Query wrote over buffer bound",(allocator<char> *)local_2d8);
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      goto LAB_003d4e4c;
    }
    dVar6 = deStringEqual("This is a debug label",buffer);
    if (dVar6 == 0) {
      buffer._60_4_ = buffer._60_4_ & 0xffffff;
      local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_1f8.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Query returned string: \"");
      std::operator<<((ostream *)poVar1,buffer);
      std::operator<<((ostream *)poVar1,"\"");
      tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Query returned wrong label",(allocator<char> *)local_2d8);
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      goto LAB_003d4e4c;
    }
    local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1f8.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Query returned string: \"");
    std::operator<<((ostream *)poVar1,buffer);
    std::operator<<((ostream *)poVar1,"\"");
    tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  else {
    de::toString<int>((string *)local_2d8,&outlen);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   "\'length\' was not 21, got ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    pMVar10 = (MessageBuilder *)local_2d8;
LAB_003d4e54:
    std::__cxx11::string::~string((string *)pMVar10);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"QueryAllNoSize",(allocator<char> *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"Query all without size",(allocator<char> *)&local_2b0);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&local_1f8,(string *)local_2d8);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Querying whole label, buffer size = 22");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  builtin_strncpy(buffer,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x40);
  (**(code **)(lVar7 + 0x958))(0x82e1,uVar5,0x16,0);
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Got Error ",&local_2dd)
    ;
    local_208 = glu::getErrorName;
    local_200 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_208);
    std::operator+(&local_290,&local_2b0,&local_270);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   &local_290,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   "getObjectLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  buffer._60_4_ = buffer._60_4_ & 0xffffff;
  sVar9 = strlen(buffer);
  if (sVar9 == 0x15) {
    if (buffer[0x15] != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Buffer was not null-terminated",(allocator<char> *)local_2d8)
      ;
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      goto LAB_003d50a2;
    }
    if (buffer[0x16] != 'X') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Query wrote over buffer bound",(allocator<char> *)local_2d8);
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      goto LAB_003d50a2;
    }
    dVar6 = deStringEqual("This is a debug label",buffer);
    if (dVar6 == 0) {
      local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_1f8.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Query returned string: \"");
      std::operator<<((ostream *)poVar1,buffer);
      std::operator<<((ostream *)poVar1,"\"");
      tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Query returned wrong label",(allocator<char> *)local_2d8);
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      goto LAB_003d50a2;
    }
    local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1f8.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Query returned string: \"");
    std::operator<<((ostream *)poVar1,buffer);
    std::operator<<((ostream *)poVar1,"\"");
    tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"Buffer length was not 21",(allocator<char> *)local_2d8);
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
LAB_003d50a2:
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"QueryLess",(allocator<char> *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"Query substring",(allocator<char> *)&local_2b0);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&local_1f8,(string *)local_2d8);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Querying whole label, buffer size = 2");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  builtin_strncpy(buffer,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x40);
  (**(code **)(lVar7 + 0x958))(0x82e1,uVar5,2,&outlen);
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Got Error ",&local_2dd)
    ;
    local_208 = glu::getErrorName;
    local_200 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_208);
    std::operator+(&local_290,&local_2b0,&local_270);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   &local_290,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   "getObjectLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  if (outlen == 1) {
    if (buffer[1] != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Buffer was not null-terminated",(allocator<char> *)local_2d8)
      ;
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
LAB_003d55dd:
      pMVar10 = &local_1f8;
      goto LAB_003d55e5;
    }
    if (buffer[2] != 'X') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Query wrote over buffer bound",(allocator<char> *)local_2d8);
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      goto LAB_003d55dd;
    }
    dVar6 = deStringBeginsWith("This is a debug label",buffer);
    if (dVar6 == 0) {
      buffer._60_4_ = buffer._60_4_ & 0xffffff;
      local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_1f8.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Query returned string: \"");
      std::operator<<((ostream *)poVar1,buffer);
      std::operator<<((ostream *)poVar1,"\"");
      tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Query returned wrong label",(allocator<char> *)local_2d8);
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      goto LAB_003d55dd;
    }
    local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1f8.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Query returned string: \"");
    std::operator<<((ostream *)poVar1,buffer);
    std::operator<<((ostream *)poVar1,"\"");
    tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  else {
    de::toString<int>((string *)local_2d8,&outlen);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   "\'length\' was not 1, got ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    pMVar10 = (MessageBuilder *)local_2d8;
LAB_003d55e5:
    std::__cxx11::string::~string((string *)pMVar10);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"QueryNone",(allocator<char> *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"Query one character",(allocator<char> *)&local_2b0);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&local_1f8,(string *)local_2d8);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Querying whole label, buffer size = 1");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  builtin_strncpy(buffer,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x40);
  (**(code **)(lVar7 + 0x958))(0x82e1,uVar5,1,&outlen);
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Got Error ",&local_2dd)
    ;
    local_208 = glu::getErrorName;
    local_200 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_208);
    std::operator+(&local_290,&local_2b0,&local_270);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   &local_290,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   "getObjectLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  if (outlen == 0) {
    if (buffer[0] != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Buffer was not null-terminated",(allocator<char> *)local_2d8)
      ;
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
LAB_003d58cd:
      pMVar10 = &local_1f8;
      goto LAB_003d58d5;
    }
    if (buffer[1] != 'X') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Query wrote over buffer bound",(allocator<char> *)local_2d8);
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      goto LAB_003d58cd;
    }
    local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1f8.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Query returned zero-sized null-terminated string");
    tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  else {
    de::toString<int>((string *)local_2d8,&outlen);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   "\'length\' was not 0, got ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    pMVar10 = (MessageBuilder *)local_2d8;
LAB_003d58d5:
    std::__cxx11::string::~string((string *)pMVar10);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  tcu::ScopedLogSection::~ScopedLogSection(&superSection);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"Sync",(allocator<char> *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"Sync object",(allocator<char> *)&local_2b0);
  tcu::ScopedLogSection::ScopedLogSection
            (&superSection,pTVar2,(string *)&local_1f8,(string *)local_2d8);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Setting label to string: \"");
  std::operator<<((ostream *)poVar1,"This is a debug label");
  std::operator<<((ostream *)poVar1,"\"");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  (**(code **)(lVar7 + 0xfc8))(uVar8,0xffffffffffffffff,"This is a debug label");
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"Got Error ",(allocator<char> *)&section);
    local_208 = glu::getErrorName;
    local_200 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_208);
    std::operator+(&local_290,&local_2b0,&local_270);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   &local_290,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   "objectPtrLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"QueryAll",(allocator<char> *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"Query All",(allocator<char> *)&local_2b0);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&local_1f8,(string *)local_2d8);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Querying whole label, buffer size = 22");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  builtin_strncpy(buffer,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x40);
  (**(code **)(lVar7 + 0x960))(uVar8,0x16,&outlen);
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Got Error ",&local_2dd)
    ;
    local_208 = glu::getErrorName;
    local_200 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_208);
    std::operator+(&local_290,&local_2b0,&local_270);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   &local_290,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   "getObjectPtrLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  if (outlen == 0x15) {
    if (buffer[0x15] != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Buffer was not null-terminated",(allocator<char> *)local_2d8)
      ;
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
LAB_003d5e66:
      pMVar10 = &local_1f8;
      goto LAB_003d5e6e;
    }
    if (buffer[0x16] != 'X') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Query wrote over buffer bound",(allocator<char> *)local_2d8);
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      goto LAB_003d5e66;
    }
    dVar6 = deStringEqual("This is a debug label",buffer);
    if (dVar6 == 0) {
      buffer._60_4_ = buffer._60_4_ & 0xffffff;
      local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_1f8.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Query returned string: \"");
      std::operator<<((ostream *)poVar1,buffer);
      std::operator<<((ostream *)poVar1,"\"");
      tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Query returned wrong label",(allocator<char> *)local_2d8);
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      goto LAB_003d5e66;
    }
    local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1f8.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Query returned string: \"");
    std::operator<<((ostream *)poVar1,buffer);
    std::operator<<((ostream *)poVar1,"\"");
    tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  else {
    de::toString<int>((string *)local_2d8,&outlen);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   "\'length\' was not 21, got ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    pMVar10 = (MessageBuilder *)local_2d8;
LAB_003d5e6e:
    std::__cxx11::string::~string((string *)pMVar10);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"QueryAllNoSize",(allocator<char> *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"Query all without size",(allocator<char> *)&local_2b0);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&local_1f8,(string *)local_2d8);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Querying whole label, buffer size = 22");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  builtin_strncpy(buffer,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x40);
  (**(code **)(lVar7 + 0x960))(uVar8,0x16,0);
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Got Error ",&local_2dd)
    ;
    local_208 = glu::getErrorName;
    local_200 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_208);
    std::operator+(&local_290,&local_2b0,&local_270);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   &local_290,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   "getObjectPtrLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  buffer._60_4_ = buffer._60_4_ & 0xffffff;
  sVar9 = strlen(buffer);
  if (sVar9 == 0x15) {
    if (buffer[0x15] != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Buffer was not null-terminated",(allocator<char> *)local_2d8)
      ;
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      goto LAB_003d60b4;
    }
    if (buffer[0x16] != 'X') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Query wrote over buffer bound",(allocator<char> *)local_2d8);
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      goto LAB_003d60b4;
    }
    dVar6 = deStringEqual("This is a debug label",buffer);
    if (dVar6 == 0) {
      local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_1f8.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Query returned string: \"");
      std::operator<<((ostream *)poVar1,buffer);
      std::operator<<((ostream *)poVar1,"\"");
      tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Query returned wrong label",(allocator<char> *)local_2d8);
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      goto LAB_003d60b4;
    }
    local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1f8.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Query returned string: \"");
    std::operator<<((ostream *)poVar1,buffer);
    std::operator<<((ostream *)poVar1,"\"");
    tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"Buffer length was not 21",(allocator<char> *)local_2d8);
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
LAB_003d60b4:
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"QueryLess",(allocator<char> *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"Query substring",(allocator<char> *)&local_2b0);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&local_1f8,(string *)local_2d8);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Querying whole label, buffer size = 2");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  builtin_strncpy(buffer,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x40);
  (**(code **)(lVar7 + 0x960))(uVar8,2,&outlen);
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Got Error ",&local_2dd)
    ;
    local_208 = glu::getErrorName;
    local_200 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_208);
    std::operator+(&local_290,&local_2b0,&local_270);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   &local_290,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   "getObjectPtrLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  if (outlen == 1) {
    if (buffer[1] != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Buffer was not null-terminated",(allocator<char> *)local_2d8)
      ;
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
LAB_003d65e7:
      pMVar10 = &local_1f8;
      goto LAB_003d65ef;
    }
    if (buffer[2] != 'X') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Query wrote over buffer bound",(allocator<char> *)local_2d8);
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      goto LAB_003d65e7;
    }
    dVar6 = deStringBeginsWith("This is a debug label",buffer);
    if (dVar6 == 0) {
      buffer._60_4_ = buffer._60_4_ & 0xffffff;
      local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_1f8.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Query returned string: \"");
      std::operator<<((ostream *)poVar1,buffer);
      std::operator<<((ostream *)poVar1,"\"");
      tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Query returned wrong label",(allocator<char> *)local_2d8);
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
      goto LAB_003d65e7;
    }
    local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1f8.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Query returned string: \"");
    std::operator<<((ostream *)poVar1,buffer);
    std::operator<<((ostream *)poVar1,"\"");
    tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  else {
    de::toString<int>((string *)local_2d8,&outlen);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   "\'length\' was not 1, got ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    pMVar10 = (MessageBuilder *)local_2d8;
LAB_003d65ef:
    std::__cxx11::string::~string((string *)pMVar10);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"QueryNone",(allocator<char> *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d8,"Query one character",(allocator<char> *)&local_2b0);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&local_1f8,(string *)local_2d8);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1f8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Querying whole label, buffer size = 1");
  tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  builtin_strncpy(buffer,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x40);
  (**(code **)(lVar7 + 0x960))(uVar8,1,&outlen);
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Got Error ",&local_2dd)
    ;
    local_208 = glu::getErrorName;
    local_200 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_208);
    std::operator+(&local_290,&local_2b0,&local_270);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   &local_290,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   "getObjectPtrLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  if (outlen == 0) {
    if (buffer[0] == '\0') {
      if (buffer[1] == 'X') {
        local_1f8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = &local_1f8.m_str;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"Query returned zero-sized null-terminated string");
        tcu::MessageBuilder::operator<<(&local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
        goto LAB_003d68dc;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Query wrote over buffer bound",(allocator<char> *)local_2d8);
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Buffer was not null-terminated",(allocator<char> *)local_2d8)
      ;
      tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    }
    pMVar10 = &local_1f8;
  }
  else {
    de::toString<int>((string *)local_2d8,&outlen);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   "\'length\' was not 0, got ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
    tcu::ResultCollector::fail(&result,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    pMVar10 = (MessageBuilder *)local_2d8;
  }
  std::__cxx11::string::~string((string *)pMVar10);
LAB_003d68dc:
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  tcu::ScopedLogSection::~ScopedLogSection(&superSection);
  (**(code **)(lVar7 + 0x470))(uVar5);
  (**(code **)(lVar7 + 0x478))(uVar8);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  return STOP;
}

Assistant:

BufferLimitedLabelCase::IterateResult BufferLimitedLabelCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	const char*	const		msg			= "This is a debug label";
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;
	char					buffer[64];

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection superSection(m_testCtx.getLog(), "Shader", "Shader object");

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, -1, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryAll", "Query All");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 22" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectLabel(GL_SHADER, shader, 22, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

			if (outlen != 21)
				result.fail("'length' was not 21, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringEqual(msg, buffer))
			{
				buffer[63] = '\0'; // make sure buffer is null terminated before printing
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryAllNoSize", "Query all without size");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 22" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectLabel(GL_SHADER, shader, 22, DE_NULL, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

			buffer[63] = '\0'; // make sure buffer is null terminated before strlen

			if (strlen(buffer) != 21)
				result.fail("Buffer length was not 21");
			else if (buffer[21] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[22] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringEqual(msg, buffer))
			{
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryLess", "Query substring");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 2" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectLabel(GL_SHADER, shader, 2, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

			if (outlen != 1)
				result.fail("'length' was not 1, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringBeginsWith(msg, buffer))
			{
				buffer[63] = '\0'; // make sure buffer is null terminated before printing
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryNone", "Query one character");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 1" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectLabel(GL_SHADER, shader, 1, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

			if (outlen != 0)
				result.fail("'length' was not 0, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned zero-sized null-terminated string" << TestLog::EndMessage;
		}
	}

	{
		const tcu::ScopedLogSection superSection(m_testCtx.getLog(), "Sync", "Sync object");

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
		gl.objectPtrLabel(sync, -1, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryAll", "Query All");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 22" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectPtrLabel(sync, 22, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

			if (outlen != 21)
				result.fail("'length' was not 21, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringEqual(msg, buffer))
			{
				buffer[63] = '\0'; // make sure buffer is null terminated before printing
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryAllNoSize", "Query all without size");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 22" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectPtrLabel(sync, 22, DE_NULL, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

			buffer[63] = '\0'; // make sure buffer is null terminated before strlen

			if (strlen(buffer) != 21)
				result.fail("Buffer length was not 21");
			else if (buffer[21] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[22] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringEqual(msg, buffer))
			{
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryLess", "Query substring");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 2" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectPtrLabel(sync, 2, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

			if (outlen != 1)
				result.fail("'length' was not 1, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else if (!deStringBeginsWith(msg, buffer))
			{
				buffer[63] = '\0'; // make sure buffer is null terminated before printing
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
				result.fail("Query returned wrong label");
			}
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "QueryNone", "Query one character");

			m_testCtx.getLog() << TestLog::Message << "Querying whole label, buffer size = 1" << TestLog::EndMessage;
			deMemset(buffer, 'X', sizeof(buffer));
			gl.getObjectPtrLabel(sync, 1, &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

			if (outlen != 0)
				result.fail("'length' was not 0, got " + de::toString(outlen));
			else if (buffer[outlen] != '\0')
				result.fail("Buffer was not null-terminated");
			else if (buffer[outlen+1] != 'X')
				result.fail("Query wrote over buffer bound");
			else
				m_testCtx.getLog() << TestLog::Message << "Query returned zero-sized null-terminated string" << TestLog::EndMessage;
		}
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}